

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O3

void event_go_to_roll_call(tgestate_t *state)

{
  uint8_t *puVar1;
  long lVar2;
  
  state->bell = '(';
  queue_message(state,message_ROLL_CALL);
  lVar2 = 0;
  do {
    set_character_route(state,"\f\r\x14\x15\x16\x0e\x0f\x17\x18\x19"[lVar2],
                        (route_t)((short)lVar2 + 0x1a));
    lVar2 = lVar2 + 1;
  } while ((char)lVar2 != '\n');
  if (state->in_solitary != '\0') {
    return;
  }
  puVar1 = &state->vischars[0].flags;
  *puVar1 = *puVar1 & 0xbf;
  state->vischars[0].route.index = '-';
  state->vischars[0].route.step = '\0';
  set_route(state,state->vischars);
  return;
}

Assistant:

static void event_go_to_roll_call(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  queue_message(state, message_ROLL_CALL);
  go_to_roll_call(state);
}